

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

value_type * __thiscall
pstack::ReaderArray<Elf64_auxv_t,_64UL>::getitem(ReaderArray<Elf64_auxv_t,_64UL> *this,size_t idx)

{
  ulong extraout_RAX;
  Exception *this_00;
  Exception local_1c0;
  
  if ((idx < this->cacheStart) || (this->cacheEnd <= idx)) {
    ReaderArray<Elf64_auxv_t,64ul>::getitem();
    if ((extraout_RAX & 1) != 0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1c0,0,0x1a0);
      Exception::Exception(&local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c0.str,"end of data while reading array",0x1f);
      Exception::Exception(this_00,&local_1c0);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return (value_type *)((long)this + (idx - this->cacheStart) * 0x10 + 0x28);
}

Assistant:

const T &ReaderArray<T, cachesize>::getitem(size_t idx) const {
   if (unlikely(cacheStart > idx || idx >= cacheEnd)) {
      size_t rc = reader.read(idx * sizeof(T) + base, cachesize * sizeof (T), reinterpret_cast<char *>(cache.data()));
      cacheStart = idx;
      cacheEnd = cacheStart + rc / sizeof(T);
      if (unlikely(rc < sizeof(T))) { // short read - consider this EOF.
         throw ( Exception() << "end of data while reading array" );
      }
   }
   return cache[idx - cacheStart];
}